

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

char * json_object_to_json_string_length(json_object *jso,int flags,size_t *length)

{
  int iVar1;
  printbuf *ppVar2;
  size_t local_30;
  size_t s;
  char *r;
  size_t *length_local;
  int flags_local;
  json_object *jso_local;
  
  s = 0;
  local_30 = 0;
  if (jso == (json_object *)0x0) {
    local_30 = 4;
    s = (size_t)anon_var_dwarf_5e7;
  }
  else {
    if (jso->_pb == (printbuf *)0x0) {
      ppVar2 = printbuf_new();
      jso->_pb = ppVar2;
      if (ppVar2 == (printbuf *)0x0) goto LAB_00105a8d;
    }
    printbuf_reset(jso->_pb);
    iVar1 = (*jso->_to_json_string)(jso,jso->_pb,0,flags);
    if (-1 < iVar1) {
      local_30 = (size_t)jso->_pb->bpos;
      s = (size_t)jso->_pb->buf;
    }
  }
LAB_00105a8d:
  if (length != (size_t *)0x0) {
    *length = local_30;
  }
  return (char *)s;
}

Assistant:

const char *json_object_to_json_string_length(struct json_object *jso, int flags, size_t *length)
{
	const char *r = NULL;
	size_t s = 0;

	if (!jso)
	{
		s = 4;
		r = "null";
	}
	else if ((jso->_pb) || (jso->_pb = printbuf_new()))
	{
		printbuf_reset(jso->_pb);

		if (jso->_to_json_string(jso, jso->_pb, 0, flags) >= 0)
		{
			s = (size_t)jso->_pb->bpos;
			r = jso->_pb->buf;
		}
	}

	if (length)
		*length = s;
	return r;
}